

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

bool __thiscall crnlib::crn_comp::pack_data_models(crn_comp *this)

{
  uchar *puVar1;
  undefined8 uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  symbol_codec sStack_c8;
  
  symbol_codec::symbol_codec(&sStack_c8);
  symbol_codec::start_encoding(&sStack_c8,0x100000);
  uVar3 = symbol_codec::encode_transmit_static_huffman_data_model
                    (&sStack_c8,&this->m_reference_dm,false,(static_huffman_data_model *)0x0);
  if (uVar3 == 0) {
LAB_0016450c:
    bVar4 = false;
  }
  else {
    lVar6 = 0;
    bVar4 = true;
    do {
      bVar5 = bVar4;
      lVar6 = lVar6 * 0x38;
      if (*(int *)((long)this->m_endpoint_index_hist + lVar6 + 0x20) != 0) {
        uVar3 = symbol_codec::encode_transmit_static_huffman_data_model
                          (&sStack_c8,
                           (static_huffman_data_model *)
                           ((long)this->m_endpoint_index_hist + lVar6 + 0x20),false,
                           (static_huffman_data_model *)0x0);
        if (uVar3 == 0) goto LAB_0016450c;
      }
      if (*(int *)((long)this->m_selector_index_hist + lVar6 + 0x20) != 0) {
        uVar3 = symbol_codec::encode_transmit_static_huffman_data_model
                          (&sStack_c8,
                           (static_huffman_data_model *)
                           ((long)this->m_selector_index_hist + lVar6 + 0x20),false,
                           (static_huffman_data_model *)0x0);
        if (uVar3 == 0) goto LAB_0016450c;
      }
      lVar6 = 1;
      bVar4 = false;
    } while (bVar5);
    symbol_codec::stop_encoding(&sStack_c8,false);
    puVar1 = (this->m_packed_data_models).m_p;
    (this->m_packed_data_models).m_p = sStack_c8.m_output_buf.m_p;
    uVar2._0_4_ = (this->m_packed_data_models).m_size;
    uVar2._4_4_ = (this->m_packed_data_models).m_capacity;
    (this->m_packed_data_models).m_size = sStack_c8.m_output_buf.m_size;
    (this->m_packed_data_models).m_capacity = sStack_c8.m_output_buf.m_capacity;
    bVar4 = true;
    sStack_c8.m_output_buf.m_p = puVar1;
    sStack_c8.m_output_buf._8_8_ = uVar2;
  }
  if (sStack_c8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(sStack_c8.m_output_syms.m_p);
  }
  if (sStack_c8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(sStack_c8.m_arith_output_buf.m_p);
  }
  if (sStack_c8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(sStack_c8.m_output_buf.m_p);
  }
  return bVar4;
}

Assistant:

bool crn_comp::pack_data_models() {
  symbol_codec codec;
  codec.start_encoding(1024 * 1024);

  if (!codec.encode_transmit_static_huffman_data_model(m_reference_dm, false))
    return false;

  for (uint i = 0; i < 2; i++) {
    if (m_endpoint_index_dm[i].get_total_syms()) {
      if (!codec.encode_transmit_static_huffman_data_model(m_endpoint_index_dm[i], false))
        return false;
    }

    if (m_selector_index_dm[i].get_total_syms()) {
      if (!codec.encode_transmit_static_huffman_data_model(m_selector_index_dm[i], false))
        return false;
    }
  }

  codec.stop_encoding(false);

  m_packed_data_models.swap(codec.get_encoding_buf());

  return true;
}